

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmParseBlanketJSCoverage.cxx
# Opt level: O0

string * __thiscall
cmParseBlanketJSCoverage::JSONParser::getValue
          (string *__return_storage_ptr__,JSONParser *this,string *line,int type)

{
  size_t endIndex;
  size_t begIndex;
  int type_local;
  string *line_local;
  JSONParser *this_local;
  string *foundFileName;
  
  std::__cxx11::string::rfind((char)line,0x2c);
  std::__cxx11::string::find_first_of((char)line,0x3a);
  if (type == 0) {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)line);
  }
  else {
    std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)line);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string getValue(std::string line, int type)
    {
    size_t begIndex;
    size_t endIndex;
    endIndex = line.rfind(',');
    begIndex = line.find_first_of(':');
    if(type == 0)
      {
      //  A unique substring to remove the extra characters
      //  around the files name in the JSON (extra " and ,)
      std::string foundFileName =
          line.substr(begIndex+3,endIndex-(begIndex+4));
      return foundFileName;
      }
    else
      {
      return line.substr(begIndex,line.npos);
      }
    }